

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.h
# Opt level: O1

void __thiscall
chrono::ChTimestepperIIorder::SetIntegrable(ChTimestepperIIorder *this,ChIntegrableIIorder *intgr)

{
  (this->super_ChTimestepper).integrable = &intgr->super_ChIntegrable;
  ChState::setZero(&this->X,1,&intgr->super_ChIntegrable);
  ChStateDelta::setZero(&this->V,1,&intgr->super_ChIntegrable);
  ChStateDelta::setZero(&this->A,1,&intgr->super_ChIntegrable);
  return;
}

Assistant:

virtual void SetIntegrable(ChIntegrableIIorder* intgr) {
        ChTimestepper::SetIntegrable(intgr);
        X.setZero(1, intgr);
        V.setZero(1, intgr);
        A.setZero(1, intgr);
    }